

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
 __thiscall anon_unknown.dwarf_5733c63::MultisigDescriptor::Clone(MultisigDescriptor *this)

{
  int threshold;
  undefined8 *puVar1;
  PubkeyProvider *pPVar2;
  pointer puVar3;
  pointer puVar4;
  MultisigDescriptor *this_00;
  long in_RSI;
  pointer puVar5;
  undefined8 *puVar6;
  pointer __p;
  long in_FS_OFFSET;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  providers;
  __uniq_ptr_impl<(anonymous_namespace)::MultisigDescriptor,_std::default_delete<(anonymous_namespace)::MultisigDescriptor>_>
  local_70;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  local_68;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ::reserve(&local_68,*(long *)(in_RSI + 0x10) - *(long *)(in_RSI + 8) >> 3);
  puVar3 = local_68.
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar6 = *(undefined8 **)(in_RSI + 8);
  puVar1 = *(undefined8 **)(in_RSI + 0x10);
  if (puVar6 != puVar1) {
    puVar5 = local_68.
             super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      (**(code **)(*(long *)*puVar6 + 0x58))(&local_50);
      puVar4 = local_50.
               super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_50.
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pPVar2 = (puVar5->_M_t).
               super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
               .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl;
      (puVar5->_M_t).
      super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
      ._M_t.
      super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
      .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl =
           (PubkeyProvider *)puVar4;
      if (pPVar2 != (PubkeyProvider *)0x0) {
        (*pPVar2->_vptr_PubkeyProvider[1])();
        if ((PubkeyProvider *)
            local_50.
            super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (PubkeyProvider *)0x0) {
          (*(*(_func_int ***)
              &(local_50.
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_t)[1])();
        }
      }
      puVar6 = puVar6 + 1;
      puVar5 = puVar5 + 1;
    } while (puVar6 != puVar1);
  }
  threshold = *(int *)(in_RSI + 0x58);
  this_00 = (MultisigDescriptor *)operator_new(0x60);
  local_50.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = puVar3;
  local_50.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_68.
       super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_50.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68.
       super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MultisigDescriptor(this_00,threshold,&local_50,*(bool *)(in_RSI + 0x5c));
  std::
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ::~vector(&local_50);
  local_70._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::MultisigDescriptor_*,_std::default_delete<(anonymous_namespace)::MultisigDescriptor>_>
  .super__Head_base<0UL,_(anonymous_namespace)::MultisigDescriptor_*,_false>._M_head_impl =
       (tuple<(anonymous_namespace)::MultisigDescriptor_*,_std::default_delete<(anonymous_namespace)::MultisigDescriptor>_>
        )(_Tuple_impl<0UL,_(anonymous_namespace)::MultisigDescriptor_*,_std::default_delete<(anonymous_namespace)::MultisigDescriptor>_>
          )0x0;
  (this->super_DescriptorImpl).super_Descriptor._vptr_Descriptor = (_func_int **)this_00;
  std::
  unique_ptr<(anonymous_namespace)::MultisigDescriptor,_std::default_delete<(anonymous_namespace)::MultisigDescriptor>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::MultisigDescriptor,_std::default_delete<(anonymous_namespace)::MultisigDescriptor>_>
                 *)&local_70);
  std::
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ::~vector(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (__uniq_ptr_data<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>,_true,_true>
            )(__uniq_ptr_data<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<DescriptorImpl> Clone() const override
    {
        std::vector<std::unique_ptr<PubkeyProvider>> providers;
        providers.reserve(m_pubkey_args.size());
        std::transform(m_pubkey_args.begin(), m_pubkey_args.end(), providers.begin(), [](const std::unique_ptr<PubkeyProvider>& p) { return p->Clone(); });
        return std::make_unique<MultisigDescriptor>(m_threshold, std::move(providers), m_sorted);
    }